

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3CreateFunc(sqlite3 *db,char *zFunctionName,int nArg,int enc,void *pUserData,
                     _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xFunc,
                     _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xStep,
                     _func_void_sqlite3_context_ptr *xFinal,FuncDestructor *pDestructor)

{
  int nName_00;
  FuncDef *pFVar1;
  int local_48;
  int rc;
  int nName;
  FuncDef *p;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xFunc_local;
  void *pUserData_local;
  int enc_local;
  int nArg_local;
  char *zFunctionName_local;
  sqlite3 *db_local;
  
  if ((((zFunctionName == (char *)0x0) ||
       ((xFunc != (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0 &&
        ((xFinal != (_func_void_sqlite3_context_ptr *)0x0 ||
         (xStep != (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0)))))) ||
      ((xFunc == (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0 &&
       ((xFinal != (_func_void_sqlite3_context_ptr *)0x0 &&
        (xStep == (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0)))))) ||
     ((((xFunc == (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0 &&
        ((xFinal == (_func_void_sqlite3_context_ptr *)0x0 &&
         (xStep != (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0)))) ||
       (nArg < -1)) ||
      ((0x7f < nArg || (nName_00 = sqlite3Strlen30(zFunctionName), 0xff < nName_00)))))) {
    db_local._4_4_ = sqlite3MisuseError(0x1c5ae);
  }
  else {
    if (enc == 4) {
      pUserData_local._0_4_ = 2;
    }
    else {
      pUserData_local._0_4_ = enc;
      if (enc == 5) {
        local_48 = sqlite3CreateFunc(db,zFunctionName,nArg,1,pUserData,xFunc,xStep,xFinal,
                                     pDestructor);
        if (local_48 == 0) {
          local_48 = sqlite3CreateFunc(db,zFunctionName,nArg,2,pUserData,xFunc,xStep,xFinal,
                                       pDestructor);
        }
        if (local_48 != 0) {
          return local_48;
        }
        pUserData_local._0_4_ = 3;
      }
    }
    pFVar1 = sqlite3FindFunction(db,zFunctionName,nName_00,nArg,(u8)(uint)pUserData_local,'\0');
    if (((pFVar1 != (FuncDef *)0x0) && (pFVar1->iPrefEnc == (uint)pUserData_local)) &&
       (pFVar1->nArg == nArg)) {
      if (db->activeVdbeCnt != 0) {
        sqlite3Error(db,5,"unable to delete/modify user-function due to active statements");
        return 5;
      }
      sqlite3ExpirePreparedStatements(db);
    }
    pFVar1 = sqlite3FindFunction(db,zFunctionName,nName_00,nArg,(u8)(uint)pUserData_local,'\x01');
    if (pFVar1 == (FuncDef *)0x0) {
      db_local._4_4_ = 7;
    }
    else {
      functionDestroy(db,pFVar1);
      if (pDestructor != (FuncDestructor *)0x0) {
        pDestructor->nRef = pDestructor->nRef + 1;
      }
      pFVar1->pDestructor = pDestructor;
      pFVar1->flags = '\0';
      pFVar1->xFunc = xFunc;
      pFVar1->xStep = xStep;
      pFVar1->xFinalize = xFinal;
      pFVar1->pUserData = pUserData;
      pFVar1->nArg = (i16)nArg;
      db_local._4_4_ = 0;
    }
  }
  return db_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3CreateFunc(
  sqlite3 *db,
  const char *zFunctionName,
  int nArg,
  int enc,
  void *pUserData,
  void (*xFunc)(sqlite3_context*,int,sqlite3_value **),
  void (*xStep)(sqlite3_context*,int,sqlite3_value **),
  void (*xFinal)(sqlite3_context*),
  FuncDestructor *pDestructor
){
  FuncDef *p;
  int nName;

  assert( sqlite3_mutex_held(db->mutex) );
  if( zFunctionName==0 ||
      (xFunc && (xFinal || xStep)) || 
      (!xFunc && (xFinal && !xStep)) ||
      (!xFunc && (!xFinal && xStep)) ||
      (nArg<-1 || nArg>SQLITE_MAX_FUNCTION_ARG) ||
      (255<(nName = sqlite3Strlen30( zFunctionName))) ){
    return SQLITE_MISUSE_BKPT;
  }
  
#ifndef SQLITE_OMIT_UTF16
  /* If SQLITE_UTF16 is specified as the encoding type, transform this
  ** to one of SQLITE_UTF16LE or SQLITE_UTF16BE using the
  ** SQLITE_UTF16NATIVE macro. SQLITE_UTF16 is not used internally.
  **
  ** If SQLITE_ANY is specified, add three versions of the function
  ** to the hash table.
  */
  if( enc==SQLITE_UTF16 ){
    enc = SQLITE_UTF16NATIVE;
  }else if( enc==SQLITE_ANY ){
    int rc;
    rc = sqlite3CreateFunc(db, zFunctionName, nArg, SQLITE_UTF8,
         pUserData, xFunc, xStep, xFinal, pDestructor);
    if( rc==SQLITE_OK ){
      rc = sqlite3CreateFunc(db, zFunctionName, nArg, SQLITE_UTF16LE,
          pUserData, xFunc, xStep, xFinal, pDestructor);
    }
    if( rc!=SQLITE_OK ){
      return rc;
    }
    enc = SQLITE_UTF16BE;
  }
#else
  enc = SQLITE_UTF8;
#endif
  
  /* Check if an existing function is being overridden or deleted. If so,
  ** and there are active VMs, then return SQLITE_BUSY. If a function
  ** is being overridden/deleted but there are no active VMs, allow the
  ** operation to continue but invalidate all precompiled statements.
  */
  p = sqlite3FindFunction(db, zFunctionName, nName, nArg, (u8)enc, 0);
  if( p && p->iPrefEnc==enc && p->nArg==nArg ){
    if( db->activeVdbeCnt ){
      sqlite3Error(db, SQLITE_BUSY, 
        "unable to delete/modify user-function due to active statements");
      assert( !db->mallocFailed );
      return SQLITE_BUSY;
    }else{
      sqlite3ExpirePreparedStatements(db);
    }
  }

  p = sqlite3FindFunction(db, zFunctionName, nName, nArg, (u8)enc, 1);
  assert(p || db->mallocFailed);
  if( !p ){
    return SQLITE_NOMEM;
  }

  /* If an older version of the function with a configured destructor is
  ** being replaced invoke the destructor function here. */
  functionDestroy(db, p);

  if( pDestructor ){
    pDestructor->nRef++;
  }
  p->pDestructor = pDestructor;
  p->flags = 0;
  p->xFunc = xFunc;
  p->xStep = xStep;
  p->xFinalize = xFinal;
  p->pUserData = pUserData;
  p->nArg = (u16)nArg;
  return SQLITE_OK;
}